

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O0

string * __thiscall
LinkedReadsDatastore::get_read_sequence_abi_cxx11_
          (string *__return_storage_ptr__,LinkedReadsDatastore *this,size_t readID)

{
  FILE *pFVar1;
  uint64_t uVar2;
  long lVar3;
  char *pcVar4;
  allocator *paVar5;
  string *this_00;
  size_t sVar6;
  long __off;
  char acStack_98 [8];
  char *local_90;
  allocator *local_88;
  allocator *local_80;
  ulong local_78;
  string *local_70;
  string *local_68;
  LinkedReadsDatastore *local_60;
  allocator local_51;
  long local_50;
  size_t read_offset_in_file;
  unsigned_long __vla_expr0;
  allocator local_21;
  size_t local_20;
  size_t readID_local;
  LinkedReadsDatastore *this_local;
  
  local_70 = __return_storage_ptr__;
  local_68 = __return_storage_ptr__;
  local_60 = this;
  local_20 = readID;
  readID_local = (size_t)this;
  this_local = (LinkedReadsDatastore *)__return_storage_ptr__;
  if ((readID != 0) &&
     (local_78 = readID, sVar6 = size((LinkedReadsDatastore *)0x3c2492), local_78 <= sVar6)) {
    read_offset_in_file = local_60->readsize + 1;
    lVar3 = -(local_60->readsize + 0x10 & 0xfffffffffffffff0);
    local_90 = acStack_98 + lVar3;
    __off = local_60->readpos_offset + (local_60->readsize + 1) * (local_20 - 1);
    pFVar1 = (FILE *)local_60->fd;
    local_50 = __off;
    __vla_expr0 = (unsigned_long)acStack_98;
    *(undefined8 *)(&stack0xffffffffffffff60 + lVar3) = 0x3c2549;
    fseek(pFVar1,__off,0);
    pcVar4 = local_90;
    uVar2 = local_60->readsize;
    pFVar1 = (FILE *)local_60->fd;
    *(undefined8 *)(&stack0xffffffffffffff60 + lVar3) = 0x3c256c;
    fread(pcVar4,uVar2 + 1,1,pFVar1);
    local_88 = &local_51;
    *(undefined8 *)(&stack0xffffffffffffff60 + lVar3) = 0x3c2579;
    std::allocator<char>::allocator();
    this_00 = local_70;
    paVar5 = local_88;
    pcVar4 = local_90;
    *(undefined8 *)(&stack0xffffffffffffff60 + lVar3) = 0x3c258d;
    std::__cxx11::string::string((string *)this_00,pcVar4,paVar5);
    *(undefined8 *)(&stack0xffffffffffffff60 + lVar3) = 0x3c2598;
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    return local_68;
  }
  local_80 = &local_21;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_70,"",local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  return local_68;
}

Assistant:

std::string LinkedReadsDatastore::get_read_sequence(size_t readID) {
    if (readID==0 or readID>size()) return "";
    char buffer[readsize+1];
    size_t read_offset_in_file=readpos_offset+(readsize+1)*(readID-1);
    fseek(fd,read_offset_in_file,SEEK_SET);
    fread(buffer,readsize+1,1,fd);
    return std::string(buffer);
}